

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_8x32_impl.h
# Opt level: O1

void secp256k1_scalar_get_b32(uchar *bin,secp256k1_scalar *a)

{
  *bin = *(uchar *)((long)a->d + 0x1f);
  bin[1] = *(uchar *)((long)a->d + 0x1e);
  bin[2] = *(uchar *)((long)a->d + 0x1d);
  bin[3] = (uchar)a->d[7];
  bin[4] = *(uchar *)((long)a->d + 0x1b);
  bin[5] = *(uchar *)((long)a->d + 0x1a);
  bin[6] = *(uchar *)((long)a->d + 0x19);
  bin[7] = (uchar)a->d[6];
  bin[8] = *(uchar *)((long)a->d + 0x17);
  bin[9] = *(uchar *)((long)a->d + 0x16);
  bin[10] = *(uchar *)((long)a->d + 0x15);
  bin[0xb] = (uchar)a->d[5];
  bin[0xc] = *(uchar *)((long)a->d + 0x13);
  bin[0xd] = *(uchar *)((long)a->d + 0x12);
  bin[0xe] = *(uchar *)((long)a->d + 0x11);
  bin[0xf] = (uchar)a->d[4];
  bin[0x10] = *(uchar *)((long)a->d + 0xf);
  bin[0x11] = *(uchar *)((long)a->d + 0xe);
  bin[0x12] = *(uchar *)((long)a->d + 0xd);
  bin[0x13] = (uchar)a->d[3];
  bin[0x14] = *(uchar *)((long)a->d + 0xb);
  bin[0x15] = *(uchar *)((long)a->d + 10);
  bin[0x16] = *(uchar *)((long)a->d + 9);
  bin[0x17] = (uchar)a->d[2];
  bin[0x18] = *(uchar *)((long)a->d + 7);
  bin[0x19] = *(uchar *)((long)a->d + 6);
  bin[0x1a] = *(uchar *)((long)a->d + 5);
  bin[0x1b] = (uchar)a->d[1];
  bin[0x1c] = *(uchar *)((long)a->d + 3);
  bin[0x1d] = *(uchar *)((long)a->d + 2);
  bin[0x1e] = *(uchar *)((long)a->d + 1);
  bin[0x1f] = (uchar)a->d[0];
  return;
}

Assistant:

static void secp256k1_scalar_get_b32(unsigned char *bin, const secp256k1_scalar* a) {
    bin[0] = a->d[7] >> 24; bin[1] = a->d[7] >> 16; bin[2] = a->d[7] >> 8; bin[3] = a->d[7];
    bin[4] = a->d[6] >> 24; bin[5] = a->d[6] >> 16; bin[6] = a->d[6] >> 8; bin[7] = a->d[6];
    bin[8] = a->d[5] >> 24; bin[9] = a->d[5] >> 16; bin[10] = a->d[5] >> 8; bin[11] = a->d[5];
    bin[12] = a->d[4] >> 24; bin[13] = a->d[4] >> 16; bin[14] = a->d[4] >> 8; bin[15] = a->d[4];
    bin[16] = a->d[3] >> 24; bin[17] = a->d[3] >> 16; bin[18] = a->d[3] >> 8; bin[19] = a->d[3];
    bin[20] = a->d[2] >> 24; bin[21] = a->d[2] >> 16; bin[22] = a->d[2] >> 8; bin[23] = a->d[2];
    bin[24] = a->d[1] >> 24; bin[25] = a->d[1] >> 16; bin[26] = a->d[1] >> 8; bin[27] = a->d[1];
    bin[28] = a->d[0] >> 24; bin[29] = a->d[0] >> 16; bin[30] = a->d[0] >> 8; bin[31] = a->d[0];
}